

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_msl.cpp
# Opt level: O0

bool __thiscall
spirv_cross::CompilerMSL::OpCodePreprocessor::handle
          (OpCodePreprocessor *this,Op opcode,uint32_t *args,uint32_t length)

{
  CompilerMSL *pCVar1;
  bool bVar2;
  uint32_t uVar3;
  SPIRVariable *pSVar4;
  pointer ppVar5;
  Variant *this_00;
  SPIRExtension *pSVar6;
  CompilerError *this_01;
  ulong uVar7;
  size_t sVar8;
  mapped_type *pmVar9;
  pair<std::__detail::_Node_iterator<unsigned_int,_true,_false>,_bool> pVar10;
  uint32_t local_12c;
  mapped_type local_128;
  uint32_t result_id;
  uint32_t result_type;
  uint32_t local_11c;
  uint32_t i;
  SPIRType *var_type;
  undefined1 local_108;
  uint32_t local_fc;
  SPIRVariable *local_f8;
  SPIRVariable *var_2;
  key_type local_e0;
  uint32_t local_dc;
  GLSLstd450 op_450;
  uint32_t extension_set;
  uint32_t local_d0;
  uint32_t ptr;
  uint32_t id;
  uint32_t result_type_1;
  undefined1 local_c0;
  uint32_t local_b4;
  SPIRVariable *local_b0;
  SPIRVariable *var_1;
  undefined1 local_a0;
  _Node_iterator_base<std::pair<const_unsigned_int,_unsigned_int>,_false> local_98;
  _Node_iterator_base<std::pair<const_unsigned_int,_unsigned_int>,_false> local_90;
  iterator it_2;
  _Node_iterator_base<std::pair<const_unsigned_int,_unsigned_int>,_false> local_78;
  _Node_iterator_base<std::pair<const_unsigned_int,_unsigned_int>,_false> local_70;
  iterator it_1;
  _Node_iterator_base<std::pair<const_unsigned_int,_unsigned_int>,_false> local_58;
  _Node_iterator_base<std::pair<const_unsigned_int,_unsigned_int>,_false> local_50;
  iterator it;
  SPIRVariable *var;
  SPVFuncImpl local_25;
  uint32_t local_24;
  SPVFuncImpl spv_func;
  uint32_t *puStack_20;
  uint32_t length_local;
  uint32_t *args_local;
  OpCodePreprocessor *pOStack_10;
  Op opcode_local;
  OpCodePreprocessor *this_local;
  
  local_24 = length;
  puStack_20 = args;
  args_local._4_4_ = opcode;
  pOStack_10 = this;
  local_25 = get_spv_func_impl(this,opcode,args,length);
  if (local_25 != SPVFuncImplNone) {
    ::std::
    set<spirv_cross::CompilerMSL::SPVFuncImpl,_std::less<spirv_cross::CompilerMSL::SPVFuncImpl>,_std::allocator<spirv_cross::CompilerMSL::SPVFuncImpl>_>
    ::insert(&this->compiler->spv_function_implementations,&local_25);
    this->suppress_missing_prototypes = true;
  }
  if (args_local._4_4_ == OpExtInst) {
    local_dc = puStack_20[2];
    pSVar6 = Compiler::get<spirv_cross::SPIRExtension>((Compiler *)this->compiler,local_dc);
    if ((*(int *)&(pSVar6->super_IVariant).field_0xc == 1) &&
       (local_e0 = puStack_20[3], local_e0 - 0x4c < 3)) {
      bVar2 = Options::supports_msl_version(&this->compiler->msl_options,2,3,0);
      if (!bVar2) {
        this_01 = (CompilerError *)__cxa_allocate_exception(0x10);
        CompilerError::CompilerError(this_01,"Pull-model interpolation requires MSL 2.3.");
        __cxa_throw(this_01,&CompilerError::typeinfo,CompilerError::~CompilerError);
      }
      local_f8 = Compiler::maybe_get_backing_variable((Compiler *)this->compiler,puStack_20[4]);
      if (local_f8 != (SPIRVariable *)0x0) {
        pCVar1 = this->compiler;
        local_fc = TypedID::operator_cast_to_unsigned_int
                             ((TypedID *)&(local_f8->super_IVariant).self);
        pVar10 = ::std::
                 unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
                 ::insert(&pCVar1->pull_model_inputs,&local_fc);
        var_type = (SPIRType *)pVar10.first.super__Node_iterator_base<unsigned_int,_false>._M_cur;
        local_108 = pVar10.second;
        _i = Compiler::get_variable_element_type((Compiler *)this->compiler,local_f8);
        local_11c = (local_f8->super_IVariant).self.id;
        bVar2 = Compiler::has_decoration((Compiler *)this->compiler,(ID)local_11c,DecorationSample);
        if (bVar2) {
          this->needs_sample_id = true;
        }
        else if (_i->basetype == Struct) {
          for (result_type = 0; uVar7 = (ulong)result_type,
              sVar8 = VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>::size
                                (&(_i->member_types).
                                  super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>),
              uVar7 < sVar8; result_type = result_type + 1) {
            pCVar1 = this->compiler;
            result_id = (uint32_t)
                        TypedID::operator_cast_to_TypedID((TypedID *)&(_i->super_IVariant).self);
            bVar2 = Compiler::has_member_decoration
                              ((Compiler *)pCVar1,(TypeID)result_id,result_type,DecorationSample);
            if (bVar2) {
              this->needs_sample_id = true;
              break;
            }
          }
        }
      }
    }
  }
  else if (args_local._4_4_ == OpFunctionCall) {
    this->suppress_missing_prototypes = true;
  }
  else if (args_local._4_4_ == OpImageTexelPointer) {
    bVar2 = Options::supports_msl_version(&this->compiler->msl_options,3,1,0);
    if (!bVar2) {
      pSVar4 = Compiler::maybe_get_backing_variable((Compiler *)this->compiler,puStack_20[2]);
      if (pSVar4 == (SPIRVariable *)0x0) {
        TypedID<(spirv_cross::Types)0>::TypedID
                  ((TypedID<(spirv_cross::Types)0> *)
                   ((long)&it.
                           super__Node_iterator_base<std::pair<const_unsigned_int,_unsigned_int>,_false>
                           ._M_cur + 4),0);
      }
      else {
        it.super__Node_iterator_base<std::pair<const_unsigned_int,_unsigned_int>,_false>._M_cur.
        _4_4_ = (pSVar4->super_IVariant).self.id;
      }
      uVar3 = TypedID::operator_cast_to_unsigned_int
                        ((TypedID *)
                         ((long)&it.
                                 super__Node_iterator_base<std::pair<const_unsigned_int,_unsigned_int>,_false>
                                 ._M_cur + 4));
      pmVar9 = ::std::
               unordered_map<unsigned_int,_unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
               ::operator[](&this->image_pointers_emulated,puStack_20 + 1);
      *pmVar9 = uVar3;
    }
  }
  else if (args_local._4_4_ == OpStore) {
    check_resource_write(this,*puStack_20);
  }
  else if (args_local._4_4_ - OpAccessChain < 3) {
    ptr = *puStack_20;
    local_d0 = puStack_20[1];
    extension_set = puStack_20[2];
    op_450._3_1_ = 1;
    Compiler::set<spirv_cross::SPIRExpression,char_const(&)[1],unsigned_int&,bool>
              ((Compiler *)this->compiler,local_d0,(char (*) [1])0x400321,&ptr,
               (bool *)((long)&op_450 + 3));
    Compiler::register_read((Compiler *)this->compiler,local_d0,extension_set,true);
    this_00 = VectorView<spirv_cross::Variant>::operator[]
                        (&(this->compiler->super_CompilerGLSL).super_Compiler.ir.ids.
                          super_VectorView<spirv_cross::Variant>,(ulong)local_d0);
    Variant::set_allow_type_rewrite(this_00);
  }
  else if (args_local._4_4_ == OpArrayLength) {
    local_b0 = Compiler::maybe_get_backing_variable((Compiler *)this->compiler,puStack_20[2]);
    if ((local_b0 != (SPIRVariable *)0x0) &&
       (bVar2 = is_var_runtime_size_array(this->compiler,local_b0), !bVar2)) {
      pCVar1 = this->compiler;
      local_b4 = TypedID::operator_cast_to_unsigned_int((TypedID *)&(local_b0->super_IVariant).self)
      ;
      pVar10 = ::std::
               unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
               ::insert(&pCVar1->buffers_requiring_array_length,&local_b4);
      _id = (__node_type *)pVar10.first.super__Node_iterator_base<unsigned_int,_false>._M_cur;
      local_c0 = pVar10.second;
    }
  }
  else if (args_local._4_4_ == OpImageWrite) {
    this->uses_image_write = true;
  }
  else if (args_local._4_4_ == OpAtomicLoad) {
    this->uses_atomics = true;
    local_90._M_cur =
         (__node_type *)
         ::std::
         unordered_map<unsigned_int,_unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
         ::find(&this->image_pointers_emulated,puStack_20 + 2);
    local_98._M_cur =
         (__node_type *)
         ::std::
         unordered_map<unsigned_int,_unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
         ::end(&this->image_pointers_emulated);
    bVar2 = ::std::__detail::operator!=(&local_90,&local_98);
    if (bVar2) {
      pCVar1 = this->compiler;
      ppVar5 = ::std::__detail::
               _Node_iterator<std::pair<const_unsigned_int,_unsigned_int>,_false,_false>::operator->
                         ((_Node_iterator<std::pair<const_unsigned_int,_unsigned_int>,_false,_false>
                           *)&local_90);
      pVar10 = ::std::
               unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
               ::insert(&pCVar1->atomic_image_vars_emulated,&ppVar5->second);
      var_1 = (SPIRVariable *)pVar10.first.super__Node_iterator_base<unsigned_int,_false>._M_cur;
      local_a0 = pVar10.second;
    }
  }
  else if (args_local._4_4_ == OpAtomicStore) {
    this->uses_atomics = true;
    local_70._M_cur =
         (__node_type *)
         ::std::
         unordered_map<unsigned_int,_unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
         ::find(&this->image_pointers_emulated,puStack_20);
    local_78._M_cur =
         (__node_type *)
         ::std::
         unordered_map<unsigned_int,_unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
         ::end(&this->image_pointers_emulated);
    bVar2 = ::std::__detail::operator!=(&local_70,&local_78);
    if (bVar2) {
      pCVar1 = this->compiler;
      ppVar5 = ::std::__detail::
               _Node_iterator<std::pair<const_unsigned_int,_unsigned_int>,_false,_false>::operator->
                         ((_Node_iterator<std::pair<const_unsigned_int,_unsigned_int>,_false,_false>
                           *)&local_70);
      pVar10 = ::std::
               unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
               ::insert(&pCVar1->atomic_image_vars_emulated,&ppVar5->second);
      it_2.super__Node_iterator_base<std::pair<const_unsigned_int,_unsigned_int>,_false>._M_cur =
           (_Node_iterator_base<std::pair<const_unsigned_int,_unsigned_int>,_false>)
           pVar10.first.super__Node_iterator_base<unsigned_int,_false>._M_cur;
      this->uses_image_write = true;
    }
    else {
      check_resource_write(this,*puStack_20);
    }
  }
  else {
    if (0xd < args_local._4_4_ - OpAtomicExchange) {
      if (args_local._4_4_ == OpGroupNonUniformInverseBallot) {
        this->needs_subgroup_invocation_id = true;
        goto LAB_003089a8;
      }
      if (args_local._4_4_ == OpGroupNonUniformBallotBitCount) {
        if (puStack_20[3] == 0) {
          this->needs_subgroup_size = true;
        }
        else {
          this->needs_subgroup_invocation_id = true;
        }
        goto LAB_003089a8;
      }
      if (args_local._4_4_ - OpGroupNonUniformBallotFindLSB < 2) {
        this->needs_subgroup_size = true;
        goto LAB_003089a8;
      }
      if (args_local._4_4_ == OpGroupNonUniformRotateKHR) {
        if (5 < local_24) {
          uVar3 = Compiler::evaluate_constant_u32((Compiler *)this->compiler,puStack_20[2]);
          if (uVar3 == 3) {
            this->needs_subgroup_invocation_id = true;
          }
          else {
            this->needs_local_invocation_index = true;
          }
        }
        goto LAB_003089a8;
      }
      if (args_local._4_4_ == OpDemoteToHelperInvocation) {
        this->uses_discard = true;
        goto LAB_003089a8;
      }
      if (args_local._4_4_ == OpIsHelperInvocationEXT) {
        bVar2 = needs_manual_helper_invocation_updates(this->compiler);
        if (bVar2) {
          this->needs_helper_invocation = true;
        }
        goto LAB_003089a8;
      }
      if (args_local._4_4_ != OpAtomicFAddEXT) goto LAB_003089a8;
    }
    this->uses_atomics = true;
    local_50._M_cur =
         (__node_type *)
         ::std::
         unordered_map<unsigned_int,_unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
         ::find(&this->image_pointers_emulated,puStack_20 + 2);
    local_58._M_cur =
         (__node_type *)
         ::std::
         unordered_map<unsigned_int,_unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
         ::end(&this->image_pointers_emulated);
    bVar2 = ::std::__detail::operator!=(&local_50,&local_58);
    if (bVar2) {
      this->uses_image_write = true;
      pCVar1 = this->compiler;
      ppVar5 = ::std::__detail::
               _Node_iterator<std::pair<const_unsigned_int,_unsigned_int>,_false,_false>::operator->
                         ((_Node_iterator<std::pair<const_unsigned_int,_unsigned_int>,_false,_false>
                           *)&local_50);
      pVar10 = ::std::
               unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
               ::insert(&pCVar1->atomic_image_vars_emulated,&ppVar5->second);
      it_1.super__Node_iterator_base<std::pair<const_unsigned_int,_unsigned_int>,_false>._M_cur =
           (_Node_iterator_base<std::pair<const_unsigned_int,_unsigned_int>,_false>)
           pVar10.first.super__Node_iterator_base<unsigned_int,_false>._M_cur;
    }
    else {
      check_resource_write(this,puStack_20[2]);
    }
  }
LAB_003089a8:
  bVar2 = Compiler::instruction_to_result_type
                    ((Compiler *)this->compiler,&local_128,&local_12c,args_local._4_4_,puStack_20,
                     local_24);
  if (bVar2) {
    pmVar9 = ::std::
             unordered_map<unsigned_int,_unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
             ::operator[](&this->result_types,&local_12c);
    *pmVar9 = local_128;
  }
  return true;
}

Assistant:

bool CompilerMSL::OpCodePreprocessor::handle(Op opcode, const uint32_t *args, uint32_t length)
{
	// Since MSL exists in a single execution scope, function prototype declarations are not
	// needed, and clutter the output. If secondary functions are output (either as a SPIR-V
	// function implementation or as indicated by the presence of OpFunctionCall), then set
	// suppress_missing_prototypes to suppress compiler warnings of missing function prototypes.

	// Mark if the input requires the implementation of an SPIR-V function that does not exist in Metal.
	SPVFuncImpl spv_func = get_spv_func_impl(opcode, args, length);
	if (spv_func != SPVFuncImplNone)
	{
		compiler.spv_function_implementations.insert(spv_func);
		suppress_missing_prototypes = true;
	}

	switch (opcode)
	{

	case OpFunctionCall:
		suppress_missing_prototypes = true;
		break;

	case OpDemoteToHelperInvocationEXT:
		uses_discard = true;
		break;

	// Emulate texture2D atomic operations
	case OpImageTexelPointer:
	{
		if (!compiler.msl_options.supports_msl_version(3, 1))
		{
			auto *var = compiler.maybe_get_backing_variable(args[2]);
			image_pointers_emulated[args[1]] = var ? var->self : ID(0);
		}
		break;
	}

	case OpImageWrite:
		uses_image_write = true;
		break;

	case OpStore:
		check_resource_write(args[0]);
		break;

	// Emulate texture2D atomic operations
	case OpAtomicExchange:
	case OpAtomicCompareExchange:
	case OpAtomicCompareExchangeWeak:
	case OpAtomicIIncrement:
	case OpAtomicIDecrement:
	case OpAtomicIAdd:
	case OpAtomicFAddEXT:
	case OpAtomicISub:
	case OpAtomicSMin:
	case OpAtomicUMin:
	case OpAtomicSMax:
	case OpAtomicUMax:
	case OpAtomicAnd:
	case OpAtomicOr:
	case OpAtomicXor:
	{
		uses_atomics = true;
		auto it = image_pointers_emulated.find(args[2]);
		if (it != image_pointers_emulated.end())
		{
			uses_image_write = true;
			compiler.atomic_image_vars_emulated.insert(it->second);
		}
		else
			check_resource_write(args[2]);
		break;
	}

	case OpAtomicStore:
	{
		uses_atomics = true;
		auto it = image_pointers_emulated.find(args[0]);
		if (it != image_pointers_emulated.end())
		{
			compiler.atomic_image_vars_emulated.insert(it->second);
			uses_image_write = true;
		}
		else
			check_resource_write(args[0]);
		break;
	}

	case OpAtomicLoad:
	{
		uses_atomics = true;
		auto it = image_pointers_emulated.find(args[2]);
		if (it != image_pointers_emulated.end())
		{
			compiler.atomic_image_vars_emulated.insert(it->second);
		}
		break;
	}

	case OpGroupNonUniformInverseBallot:
		needs_subgroup_invocation_id = true;
		break;

	case OpGroupNonUniformBallotFindLSB:
	case OpGroupNonUniformBallotFindMSB:
		needs_subgroup_size = true;
		break;

	case OpGroupNonUniformBallotBitCount:
		if (args[3] == GroupOperationReduce)
			needs_subgroup_size = true;
		else
			needs_subgroup_invocation_id = true;
		break;

	case OpGroupNonUniformRotateKHR:
		// Add the correct invocation ID for calculating clustered rotate case.
		if (length > 5)
		{
			if (static_cast<Scope>(compiler.evaluate_constant_u32(args[2])) == ScopeSubgroup)
				needs_subgroup_invocation_id = true;
			else
				needs_local_invocation_index = true;
		}
		break;

	case OpArrayLength:
	{
		auto *var = compiler.maybe_get_backing_variable(args[2]);
		if (var != nullptr)
		{
			if (!compiler.is_var_runtime_size_array(*var))
				compiler.buffers_requiring_array_length.insert(var->self);
		}
		break;
	}

	case OpInBoundsAccessChain:
	case OpAccessChain:
	case OpPtrAccessChain:
	{
		// OpArrayLength might want to know if taking ArrayLength of an array of SSBOs.
		uint32_t result_type = args[0];
		uint32_t id = args[1];
		uint32_t ptr = args[2];

		compiler.set<SPIRExpression>(id, "", result_type, true);
		compiler.register_read(id, ptr, true);
		compiler.ir.ids[id].set_allow_type_rewrite();
		break;
	}

	case OpExtInst:
	{
		uint32_t extension_set = args[2];
		if (compiler.get<SPIRExtension>(extension_set).ext == SPIRExtension::GLSL)
		{
			auto op_450 = static_cast<GLSLstd450>(args[3]);
			switch (op_450)
			{
			case GLSLstd450InterpolateAtCentroid:
			case GLSLstd450InterpolateAtSample:
			case GLSLstd450InterpolateAtOffset:
			{
				if (!compiler.msl_options.supports_msl_version(2, 3))
					SPIRV_CROSS_THROW("Pull-model interpolation requires MSL 2.3.");
				// Fragment varyings used with pull-model interpolation need special handling,
				// due to the way pull-model interpolation works in Metal.
				auto *var = compiler.maybe_get_backing_variable(args[4]);
				if (var)
				{
					compiler.pull_model_inputs.insert(var->self);
					auto &var_type = compiler.get_variable_element_type(*var);
					// In addition, if this variable has a 'Sample' decoration, we need the sample ID
					// in order to do default interpolation.
					if (compiler.has_decoration(var->self, DecorationSample))
					{
						needs_sample_id = true;
					}
					else if (var_type.basetype == SPIRType::Struct)
					{
						// Now we need to check each member and see if it has this decoration.
						for (uint32_t i = 0; i < var_type.member_types.size(); ++i)
						{
							if (compiler.has_member_decoration(var_type.self, i, DecorationSample))
							{
								needs_sample_id = true;
								break;
							}
						}
					}
				}
				break;
			}
			default:
				break;
			}
		}
		break;
	}

	case OpIsHelperInvocationEXT:
		if (compiler.needs_manual_helper_invocation_updates())
			needs_helper_invocation = true;
		break;

	default:
		break;
	}

	// If it has one, keep track of the instruction's result type, mapped by ID
	uint32_t result_type, result_id;
	if (compiler.instruction_to_result_type(result_type, result_id, opcode, args, length))
		result_types[result_id] = result_type;

	return true;
}